

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O1

void fft_exec(fft_object obj,fft_data *inp,fft_data *oup)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  fft_data *oup_00;
  fft_data *oup_01;
  fft_data *inp_00;
  fft_data *oup_02;
  void *__ptr;
  ulong uVar8;
  double *pdVar9;
  int iVar10;
  uint uVar11;
  double *pdVar12;
  int iVar13;
  size_t sVar14;
  size_t __size;
  long lVar15;
  int iVar16;
  long lVar17;
  int len2;
  double dVar18;
  double dVar19;
  
  if (obj->lt == 1) {
    uVar3 = obj->N;
    lVar17 = (long)(int)uVar3;
    iVar4 = obj->sgn;
    obj->lt = 0;
    dVar18 = log10((double)(int)uVar3);
    dVar18 = ceil(dVar18 / 0.3010299956639812);
    dVar18 = exp2(dVar18);
    iVar10 = (int)dVar18;
    iVar5 = obj->N;
    iVar6 = obj->sgn;
    uVar11 = iVar10 << (iVar10 < (int)(uVar3 * 2 + -2));
    iVar13 = uVar3 * 2;
    obj->N = uVar11;
    sVar14 = (long)(int)uVar11 * 0x10;
    oup_00 = (fft_data *)malloc(sVar14);
    oup_01 = (fft_data *)malloc(sVar14);
    inp_00 = (fft_data *)malloc(sVar14);
    oup_02 = (fft_data *)malloc(sVar14);
    __size = lVar17 * 0x10;
    __ptr = malloc(__size);
    if (0 < lVar17) {
      iVar7 = iVar13 + 1;
      lVar15 = 0;
      iVar16 = 0;
      do {
        dVar18 = (double)iVar16 * (3.141592653589793 / (double)(int)uVar3);
        dVar19 = cos(dVar18);
        *(double *)((long)__ptr + lVar15 * 0x10) = dVar19;
        dVar18 = sin(dVar18);
        *(double *)((long)__ptr + lVar15 * 0x10 + 8) = dVar18;
        inp_00[lVar15].re = dVar19;
        inp_00[lVar15].im = dVar18;
        iVar16 = iVar16 + iVar7;
        do {
          iVar16 = iVar16 + uVar3 * -2;
        } while (iVar16 != iVar13 && SBORROW4(iVar16,iVar13) == (int)(iVar16 + uVar3 * -2) < 0);
        lVar15 = lVar15 + 1;
        iVar7 = iVar7 + 2;
      } while (lVar15 != lVar17);
    }
    if ((int)uVar3 <= (int)(uVar11 - uVar3)) {
      memset(inp_00 + lVar17,0,(ulong)(uVar11 + uVar3 * -2) * 0x10 + 0x10);
    }
    iVar13 = (uVar11 - uVar3) + 1;
    if (iVar13 < (int)uVar11) {
      iVar7 = uVar3 - 1;
      pdVar9 = &inp_00[iVar13].im;
      pdVar12 = (double *)((long)__ptr + sVar14 + (long)iVar13 * -0x10 + 8);
      do {
        ((fft_data *)(pdVar9 + -1))->re = pdVar12[-1];
        *pdVar9 = *pdVar12;
        pdVar9 = pdVar9 + 2;
        pdVar12 = pdVar12 + -2;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    if (0 < iVar10) {
      uVar8 = 1;
      if (1 < (int)uVar11) {
        uVar8 = (ulong)uVar11;
      }
      lVar15 = 0;
      do {
        *(double *)((long)&inp_00->im + lVar15) =
             *(double *)((long)&inp_00->im + lVar15) * (1.0 / (double)(int)uVar11);
        *(double *)((long)&inp_00->re + lVar15) =
             *(double *)((long)&inp_00->re + lVar15) * (1.0 / (double)(int)uVar11);
        lVar15 = lVar15 + 0x10;
      } while (uVar8 * 0x10 != lVar15);
    }
    fft_exec(obj,inp_00,oup_01);
    if (iVar4 == 1) {
      if (0 < (int)uVar3) {
        sVar14 = 0;
        do {
          dVar18 = *(double *)((long)&inp->re + sVar14);
          dVar19 = *(double *)((long)&inp->im + sVar14);
          dVar1 = *(double *)((long)__ptr + sVar14);
          dVar2 = *(double *)((long)__ptr + sVar14 + 8);
          *(double *)((long)&inp_00->re + sVar14) = dVar18 * dVar1 + dVar19 * dVar2;
          *(double *)((long)&inp_00->im + sVar14) = dVar1 * dVar19 - dVar18 * dVar2;
          sVar14 = sVar14 + 0x10;
        } while (__size != sVar14);
      }
    }
    else if (0 < (int)uVar3) {
      sVar14 = 0;
      do {
        dVar18 = *(double *)((long)&inp->re + sVar14);
        dVar19 = *(double *)((long)&inp->im + sVar14);
        dVar1 = *(double *)((long)__ptr + sVar14);
        dVar2 = *(double *)((long)__ptr + sVar14 + 8);
        *(double *)((long)&inp_00->re + sVar14) = dVar18 * dVar1 - dVar2 * dVar19;
        *(double *)((long)&inp_00->im + sVar14) = dVar18 * dVar2 + dVar1 * dVar19;
        sVar14 = sVar14 + 0x10;
      } while (__size != sVar14);
    }
    if ((int)uVar3 < (int)uVar11) {
      memset(inp_00 + lVar17,0,(ulong)(~uVar3 + uVar11) * 0x10 + 0x10);
    }
    fft_exec(obj,inp_00,oup_00);
    if (iVar4 == 1) {
      if (0 < iVar10) {
        uVar8 = 1;
        if (1 < (int)uVar11) {
          uVar8 = (ulong)uVar11;
        }
        lVar17 = 0;
        do {
          dVar18 = *(double *)((long)&oup_00->re + lVar17);
          dVar19 = *(double *)((long)&oup_00->im + lVar17);
          dVar1 = *(double *)((long)&oup_01->re + lVar17);
          dVar2 = *(double *)((long)&oup_01->im + lVar17);
          *(double *)((long)&oup_00->im + lVar17) = dVar18 * dVar2 + dVar1 * dVar19;
          *(double *)((long)&oup_00->re + lVar17) = dVar18 * dVar1 - dVar2 * dVar19;
          lVar17 = lVar17 + 0x10;
        } while (uVar8 * 0x10 != lVar17);
      }
    }
    else if (0 < iVar10) {
      uVar8 = 1;
      if (1 < (int)uVar11) {
        uVar8 = (ulong)uVar11;
      }
      lVar17 = 0;
      do {
        dVar18 = *(double *)((long)&oup_00->re + lVar17);
        dVar19 = *(double *)((long)&oup_00->im + lVar17);
        dVar1 = *(double *)((long)&oup_01->re + lVar17);
        dVar2 = *(double *)((long)&oup_01->im + lVar17);
        *(double *)((long)&oup_00->im + lVar17) = dVar1 * dVar19 - dVar18 * dVar2;
        *(double *)((long)&oup_00->re + lVar17) = dVar18 * dVar1 + dVar19 * dVar2;
        lVar17 = lVar17 + 0x10;
      } while (uVar8 * 0x10 != lVar17);
    }
    if (0 < iVar10) {
      uVar8 = 1;
      if (1 < (int)uVar11) {
        uVar8 = (ulong)uVar11;
      }
      lVar17 = 0;
      do {
        *(ulong *)((long)&obj->twiddle[0].im + lVar17) =
             *(ulong *)((long)&obj->twiddle[0].im + lVar17) ^ 0x8000000000000000;
        lVar17 = lVar17 + 0x10;
      } while (uVar8 * 0x10 != lVar17);
    }
    obj->sgn = -iVar4;
    fft_exec(obj,oup_00,oup_02);
    if (iVar4 == 1) {
      if (0 < (int)uVar3) {
        sVar14 = 0;
        do {
          dVar18 = *(double *)((long)&oup_02->re + sVar14);
          dVar19 = *(double *)((long)&oup_02->im + sVar14);
          dVar1 = *(double *)((long)__ptr + sVar14);
          dVar2 = *(double *)((long)__ptr + sVar14 + 8);
          *(double *)((long)&oup->re + sVar14) = dVar18 * dVar1 + dVar19 * dVar2;
          *(double *)((long)&oup->im + sVar14) = dVar1 * dVar19 - dVar18 * dVar2;
          sVar14 = sVar14 + 0x10;
        } while (__size != sVar14);
      }
    }
    else if (0 < (int)uVar3) {
      sVar14 = 0;
      do {
        dVar18 = *(double *)((long)&oup_02->re + sVar14);
        dVar19 = *(double *)((long)&oup_02->im + sVar14);
        dVar1 = *(double *)((long)__ptr + sVar14);
        dVar2 = *(double *)((long)__ptr + sVar14 + 8);
        *(double *)((long)&oup->re + sVar14) = dVar18 * dVar1 - dVar2 * dVar19;
        *(double *)((long)&oup->im + sVar14) = dVar18 * dVar2 + dVar1 * dVar19;
        sVar14 = sVar14 + 0x10;
      } while (__size != sVar14);
    }
    obj->sgn = iVar6;
    obj->N = iVar5;
    obj->lt = 1;
    if (0 < iVar10) {
      uVar8 = 1;
      if (1 < (int)uVar11) {
        uVar8 = (ulong)uVar11;
      }
      lVar17 = 0;
      do {
        *(ulong *)((long)&obj->twiddle[0].im + lVar17) =
             *(ulong *)((long)&obj->twiddle[0].im + lVar17) ^ 0x8000000000000000;
        lVar17 = lVar17 + 0x10;
      } while (uVar8 * 0x10 != lVar17);
    }
    free(oup_00);
    free(oup_02);
    free(inp_00);
    free(oup_01);
    free(__ptr);
    return;
  }
  if (obj->lt == 0) {
    mixed_radix_dit_rec(oup,inp,obj,obj->sgn,obj->N,1,0);
  }
  return;
}

Assistant:

void fft_exec(fft_object obj,fft_data *inp,fft_data *oup) {
	if (obj->lt == 0) {
		//fftct_radix3_dit_rec(inp,oup,obj, obj->sgn, obj->N);
		//fftct_mixed_rec(inp,oup,obj, obj->sgn, obj->N);
		//printf("%f \n", 1.785);
		int l,inc;
		int nn,sgn1;
		nn = obj->N;
		sgn1 = obj->sgn;
		l = 1;
		inc = 0;
		//radix3_dit_rec(oup,inp,obj,sgn1,nn,l);
		mixed_radix_dit_rec(oup,inp,obj,sgn1,nn,l,inc);
	} else if (obj->lt == 1){
		//printf("%f \n", 1.785);
		int nn,sgn1;
		nn = obj->N;
		sgn1 = obj->sgn;
		bluestein_fft(inp,oup,obj,sgn1,nn);

	}

}